

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.cpp
# Opt level: O2

int __thiscall
TPZFMatrix<double>::Decompose_LU
          (TPZFMatrix<double> *this,list<long,_std::allocator<long>_> *singular)

{
  ulong row;
  ulong uVar1;
  byte bVar2;
  double *pdVar3;
  double *pdVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  int i;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double local_68;
  ulong local_50;
  list<long,_std::allocator<long>_> *local_48;
  ulong local_40;
  ulong local_38;
  
  bVar2 = (this->super_TPZMatrix<double>).super_TPZBaseMatrix.fDecomposed;
  local_48 = singular;
  if (1 < bVar2) {
    Error("Decompose_LU <Matrix already Decomposed with other scheme>",(char *)0x0);
    bVar2 = (this->super_TPZMatrix<double>).super_TPZBaseMatrix.fDecomposed;
  }
  if (bVar2 == 0) {
    uVar1 = (this->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    local_38 = (this->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol;
    uVar6 = uVar1;
    if ((long)local_38 < (long)uVar1) {
      uVar6 = local_38;
    }
    local_40 = uVar6 & 0xffffffff;
    if ((int)uVar6 < 1) {
      local_40 = 0;
    }
    lVar8 = 1;
    uVar6 = 0;
    while (uVar6 != local_40) {
      (*(this->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0x24])
                (this,uVar6,uVar6);
      lVar7 = lVar8;
      local_68 = extraout_XMM0_Qa;
      if (ABS(extraout_XMM0_Qa) < 1e-12) {
        local_50 = uVar6;
        std::__cxx11::list<long,_std::allocator<long>_>::push_back
                  (local_48,(value_type_conflict5 *)&local_50);
        local_50 = 0x3ff0000000000000;
        (*(this->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
          [0x23])(this,uVar6,uVar6,&local_50);
        local_68 = 1.0;
      }
      for (; (int)lVar7 < (int)uVar1; lVar7 = lVar7 + 1) {
        pdVar3 = operator()(this,lVar7,uVar6);
        *pdVar3 = *pdVar3 / local_68;
      }
      row = uVar6 + 1;
      for (lVar7 = lVar8; (int)lVar7 < (int)local_38; lVar7 = lVar7 + 1) {
        pdVar3 = operator()(this,row,lVar7);
        pdVar4 = operator()(this,row,uVar6);
        (*(this->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
          [0x24])(this,uVar6,lVar7);
        for (lVar5 = 0; (int)lVar5 + (int)lVar8 < (int)uVar1; lVar5 = lVar5 + 1) {
          pdVar3[lVar5] = pdVar3[lVar5] - pdVar4[lVar5] * extraout_XMM0_Qa_00;
        }
      }
      lVar8 = lVar8 + 1;
      uVar6 = row;
    }
    (this->super_TPZMatrix<double>).super_TPZBaseMatrix.fDecomposed = '\x01';
  }
  return 1;
}

Assistant:

int TPZFMatrix<TVar>::Decompose_LU(std::list<int64_t> &singular) {
    //return Decompose_LU();
#ifndef USING_LAPACK
    if (  this->fDecomposed && this->fDecomposed != ELU)  Error( "Decompose_LU <Matrix already Decomposed with other scheme>" );
#else
    if (  this->fDecomposed && this->fDecomposed != ELUPivot)  Error( "Decompose_LU <Matrix already Decomposed with other scheme>" );
#endif
    if (this->fDecomposed) return 1;
    
    const int  min = ( this->Cols() < (this->Rows()) ) ? this->Cols() : this->Rows();
    const int nrows = this->Rows();
    const int ncols = this->Cols();
    
    for ( int k = 0; k < min ; k++ ) {
        TVar pivot = GetVal(k, k);
        if (IsZero( pivot )){
            singular.push_back(k);
            PutVal(k,k,1.);
            pivot = 1.;
        }
        for ( int i = k+1; i < nrows; i++ ) {
            this->operator()(i,k) /= pivot;
        }
        for ( int j = k+1; j < ncols; j++ ){
            int i = k+1;
            TVar * elemPtr = &(this->operator()(i,j));
            TVar * ikPtr = &(this->operator()(i,k));
            const TVar kjVal = GetVal(k,j);
            for ( ; i < nrows; i++, elemPtr++, ikPtr++ ) {
                (*elemPtr) -= (*ikPtr)*kjVal;
                //          this->operator()(i,j) -= GetVal( i, k )*GetVal(k,j);
            }
        }
    }
    this->fDecomposed=ELU;
#ifdef USING_LAPACK
    fPivot.resize(nrows);
    for (int i=0; i<nrows; i++) {
        fPivot[i] = i+1;
    }
    this->fDecomposed = ELUPivot;
#endif //USING_LAPACK
    return 1;
}